

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<float,_3,_2> * tcu::operator*(Matrix<float,_3,_2> *a,Matrix<float,_2,_2> *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Vector<float,_3> *pVVar6;
  int row;
  long lVar7;
  Matrix<float,_3,_2> *res;
  Matrix<float,_3,_2> *in_RDI;
  float fVar8;
  
  (in_RDI->m_data).m_data[0].m_data[0] = 0.0;
  (in_RDI->m_data).m_data[0].m_data[1] = 0.0;
  *(undefined8 *)((in_RDI->m_data).m_data[0].m_data + 2) = 0;
  pVVar6 = (in_RDI->m_data).m_data;
  pVVar6[1].m_data[1] = 0.0;
  pVVar6[1].m_data[2] = 0.0;
  lVar7 = 0;
  do {
    fVar8 = 1.0;
    if (lVar7 != 0) {
      fVar8 = 0.0;
    }
    (in_RDI->m_data).m_data[0].m_data[lVar7] = fVar8;
    fVar8 = 1.0;
    if (lVar7 != 1) {
      fVar8 = 0.0;
    }
    (in_RDI->m_data).m_data[1].m_data[lVar7] = fVar8;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  fVar8 = (b->m_data).m_data[0].m_data[0];
  fVar1 = (b->m_data).m_data[0].m_data[1];
  fVar2 = (b->m_data).m_data[1].m_data[0];
  fVar3 = (b->m_data).m_data[1].m_data[1];
  lVar7 = -3;
  do {
    fVar4 = (a->m_data).m_data[1].m_data[lVar7];
    fVar5 = a[1].m_data.m_data[0].m_data[lVar7];
    (in_RDI->m_data).m_data[1].m_data[lVar7] = fVar5 * fVar1 + fVar4 * fVar8 + 0.0;
    in_RDI[1].m_data.m_data[0].m_data[lVar7] = fVar5 * fVar3 + fVar4 * fVar2 + 0.0;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0);
  return in_RDI;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}